

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O2

void __thiscall protozero::pbf_reader::skip(pbf_reader *this)

{
  assert_error *this_00;
  pbf_length_type pStack_20;
  
  if (this->m_tag != 0) {
    switch(this->m_wire_type) {
    case varint:
      skip_varint(&this->m_data,this->m_end);
      return;
    case fixed64:
      pStack_20 = 8;
      break;
    case length_delimited:
      pStack_20 = get_varint<unsigned_int>(this);
      break;
    default:
      return;
    case fixed32:
      pStack_20 = 4;
    }
    skip_bytes(this,pStack_20);
    return;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"tag() != 0 && \"call next() before calling skip()\"");
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void skip() {
        protozero_assert(tag() != 0 && "call next() before calling skip()");
        switch (wire_type()) {
            case pbf_wire_type::varint:
                skip_varint(&m_data, m_end);
                break;
            case pbf_wire_type::fixed64:
                skip_bytes(8);
                break;
            case pbf_wire_type::length_delimited:
                skip_bytes(get_length());
                break;
            case pbf_wire_type::fixed32:
                skip_bytes(4);
                break;
            default:
                break;
        }
    }